

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStrstr(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  int local_34;
  int n_val;
  xmlChar *val;
  int n_str;
  xmlChar *str;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (val._4_4_ = 0; (int)val._4_4_ < 5; val._4_4_ = val._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_const_xmlChar_ptr(val._4_4_,0);
      val_01 = gen_const_xmlChar_ptr(local_34,1);
      val_02 = (xmlChar *)xmlStrstr(val_00,val_01);
      desret_const_xmlChar_ptr(val_02);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(val._4_4_,val_00,0);
      des_const_xmlChar_ptr(local_34,val_01,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrstr",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)val._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlStrstr(void) {
    int test_ret = 0;

    int mem_base;
    const xmlChar * ret_val;
    const xmlChar * str; /* the xmlChar * array (haystack) */
    int n_str;
    const xmlChar * val; /* the xmlChar to search (needle) */
    int n_val;

    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_val = 0;n_val < gen_nb_const_xmlChar_ptr;n_val++) {
        mem_base = xmlMemBlocks();
        str = gen_const_xmlChar_ptr(n_str, 0);
        val = gen_const_xmlChar_ptr(n_val, 1);

        ret_val = xmlStrstr(str, val);
        desret_const_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_str, str, 0);
        des_const_xmlChar_ptr(n_val, val, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStrstr",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_str);
            printf(" %d", n_val);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}